

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> __thiscall
wabt::MakeUnique<wabt::ConstExpr,wabt::Const>(wabt *this,Const *args)

{
  Const *c;
  ConstExpr *this_00;
  Location local_38;
  Const *local_18;
  Const *args_local;
  
  local_18 = args;
  args_local = (Const *)this;
  this_00 = (ConstExpr *)operator_new(0x88);
  c = local_18;
  Location::Location(&local_38);
  ConstExpr::ConstExpr(this_00,c,&local_38);
  std::unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>>::
  unique_ptr<std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>> *)this,this_00);
  return (__uniq_ptr_data<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}